

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmctest.cpp
# Opt level: O2

double * getPartials(char *sequence,int repeats)

{
  undefined1 (*pauVar1) [16];
  undefined8 *puVar2;
  char cVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  size_t sVar6;
  double *pdVar7;
  long lVar8;
  undefined1 auVar9 [16];
  
  sVar6 = strlen(sequence);
  uVar5 = (uint)sVar6;
  pdVar7 = (double *)malloc((long)(int)uVar5 << 5);
  auVar9 = ZEXT816(0) << 0x40;
  auVar4 = vmovhps_avx(auVar9,0x3ff0000000000000);
  for (lVar8 = 0; (ulong)(~((int)uVar5 >> 0x1f) & uVar5) << 5 != lVar8; lVar8 = lVar8 + 0x20) {
    cVar3 = *sequence;
    pauVar1 = (undefined1 (*) [16])((long)pdVar7 + lVar8);
    if (cVar3 == 'T') {
      *(undefined8 *)pauVar1[1] = 0;
      *pauVar1 = auVar9;
      *(undefined8 *)((long)pdVar7 + lVar8 + 0x18) = 0x3ff0000000000000;
    }
    else if (cVar3 == 'C') {
      *(undefined1 (*) [16])((long)pdVar7 + lVar8) = auVar4;
      *(undefined1 (*) [16])((long)pdVar7 + lVar8 + 0x10) = auVar9;
    }
    else if (cVar3 == 'G') {
      *pauVar1 = auVar9;
      puVar2 = (undefined8 *)((long)pdVar7 + lVar8 + 0x10);
      *puVar2 = 0x3ff0000000000000;
      puVar2[1] = 0;
    }
    else if (cVar3 == 'A') {
      *(undefined8 *)((long)pdVar7 + lVar8) = 0x3ff0000000000000;
      *(undefined8 *)((long)pdVar7 + lVar8 + 0x18) = 0;
      *(undefined1 (*) [16])((long)pdVar7 + lVar8 + 8) = auVar9;
    }
    else {
      *(undefined8 *)*pauVar1 = 0x3ff0000000000000;
      *(undefined8 *)(*pauVar1 + 8) = 0x3ff0000000000000;
      *(undefined8 *)pauVar1[1] = 0x3ff0000000000000;
      *(undefined8 *)(pauVar1[1] + 8) = 0x3ff0000000000000;
    }
    sequence = sequence + 1;
  }
  return pdVar7;
}

Assistant:

double* getPartials(char *sequence, int repeats) {
	int n = strlen(sequence);
	double *partials = (double*)malloc(sizeof(double) * n * 4);

    int k = 0;
	for (int i = 0; i < n; i++) {
		switch (sequence[i]) {
			case 'A':
				partials[k++] = 1;
				partials[k++] = 0;
				partials[k++] = 0;
				partials[k++] = 0;
				break;
			case 'C':
				partials[k++] = 0;
				partials[k++] = 1;
				partials[k++] = 0;
				partials[k++] = 0;
				break;
			case 'G':
				partials[k++] = 0;
				partials[k++] = 0;
				partials[k++] = 1;
				partials[k++] = 0;
				break;
			case 'T':
				partials[k++] = 0;
				partials[k++] = 0;
				partials[k++] = 0;
				partials[k++] = 1;
				break;
			default:
				partials[k++] = 1;
				partials[k++] = 1;
				partials[k++] = 1;
				partials[k++] = 1;
				break;
		}
	}
	return partials;
}